

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O1

void __thiscall
wasm::StructUtils::FunctionStructValuesMap<wasm::LUBFinder>::FunctionStructValuesMap
          (FunctionStructValuesMap<wasm::LUBFinder> *this,Module *wasm)

{
  pointer puVar1;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar2;
  _Head_base<0UL,_wasm::Function_*,_false> local_30;
  
  (this->
  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
  )._M_h._M_buckets =
       &(this->
        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
        )._M_h._M_single_bucket;
  (this->
  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
  )._M_h._M_bucket_count = 1;
  (this->
  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
  )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->
  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
  )._M_h._M_element_count = 0;
  (this->
  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
  )._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->
  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
  )._M_h._M_rehash_policy._M_next_resize = 0;
  (this->
  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
  )._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar2 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    do {
      local_30._M_head_impl =
           (puVar2->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      std::__detail::
      _Map_base<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)this,&local_30._M_head_impl);
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  return;
}

Assistant:

FunctionStructValuesMap(Module& wasm) {
    // Initialize the data for each function in preparation for parallel
    // computation.
    for (auto& func : wasm.functions) {
      (*this)[func.get()];
    }
  }